

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O0

void __thiscall tchecker::clockbounds::clockbounds_t::clear(clockbounds_t *this)

{
  element_type *this_00;
  element_type *this_01;
  element_type *this_02;
  element_type *this_03;
  clockbounds_t *this_local;
  
  this_00 = std::
            __shared_ptr_access<tchecker::clockbounds::global_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<tchecker::clockbounds::global_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  global_lu_map_t::clear(this_00);
  this_01 = std::
            __shared_ptr_access<tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<tchecker::clockbounds::global_m_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->_global_m);
  global_m_map_t::clear(this_01);
  this_02 = std::
            __shared_ptr_access<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<tchecker::clockbounds::local_lu_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->_local_lu);
  local_lu_map_t::clear(this_02);
  this_03 = std::
            __shared_ptr_access<tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<tchecker::clockbounds::local_m_map_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->_local_m);
  local_m_map_t::clear(this_03);
  return;
}

Assistant:

void clockbounds_t::clear()
{
  _global_lu->clear();
  _global_m->clear();
  _local_lu->clear();
  _local_m->clear();
}